

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int Symbolcmpp(void *_a,void *_b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i2;
  int i1;
  symbol **b;
  symbol **a;
  void *_b_local;
  void *_a_local;
  
  iVar1 = *(int *)(*_a + 8) + (uint)('Z' < *(char *)**_a) * 10000000;
  iVar2 = *(int *)(*_b + 8) + (uint)('Z' < *(char *)**_b) * 10000000;
  if (iVar1 == iVar2) {
    iVar3 = strcmp((char *)**_a,(char *)**_b);
    if (iVar3 != 0) {
      __assert_fail("i1!=i2 || strcmp((**a).name,(**b).name)==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                    ,0x119c,"int Symbolcmpp(const void *, const void *)");
    }
  }
  return iVar1 - iVar2;
}

Assistant:

int Symbolcmpp(const void *_a, const void *_b)
{
  const struct symbol **a = (const struct symbol **) _a;
  const struct symbol **b = (const struct symbol **) _b;
  int i1 = (**a).index + 10000000*((**a).name[0]>'Z');
  int i2 = (**b).index + 10000000*((**b).name[0]>'Z');
  assert( i1!=i2 || strcmp((**a).name,(**b).name)==0 );
  return i1-i2;
}